

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http1_parser.c
# Opt level: O1

size_t http1_fio_parser_fn(http1_fio_parser_args_s *args)

{
  uint8_t *puVar1;
  ssize_t *psVar2;
  http1_parser_protected_read_only_state_s *phVar3;
  byte bVar4;
  long lVar5;
  _func_int_http1_parser_s_ptr_size_t_char_ptr_size_t *p_Var6;
  bool bVar7;
  uint8_t uVar8;
  byte bVar9;
  byte bVar10;
  int iVar11;
  int iVar12;
  byte *pbVar13;
  __int32_t **pp_Var14;
  byte *pbVar15;
  size_t sVar16;
  byte *pbVar17;
  size_t __n;
  byte *pbVar18;
  http1_parser_s *phVar19;
  byte *pbVar20;
  byte *pbVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  uint8_t *tmp;
  byte *local_50;
  byte *local_48;
  byte *local_40;
  byte *local_38;
  
  (args->parser->state).next = (uint8_t *)0x0;
  pbVar18 = (byte *)args->buffer;
  local_38 = pbVar18 + args->length;
  pbVar21 = pbVar18;
  do {
    pbVar20 = local_38;
    phVar19 = args->parser;
    bVar10 = (phVar19->state).reserved;
    if ((bVar10 & 0xf) != 3) {
      if ((bVar10 & 0xf) != 1) {
        if ((bVar10 & 0xf) != 0) goto LAB_0015e893;
        bVar23 = pbVar21 < local_38;
        if (bVar23) {
          __n = (long)local_38 - (long)pbVar21;
          do {
            if ((0x20 < (ulong)*pbVar21) || ((0x100002401U >> ((ulong)*pbVar21 & 0x3f) & 1) == 0)) {
              if ((bVar23) && (*pbVar21 != 10)) {
                pbVar18 = (byte *)memchr(pbVar21,10,__n);
                if (pbVar18 == (byte *)0x0) {
                  bVar9 = 0;
                }
                else {
                  bVar9 = (pbVar18[-1] == 0xd) + 1;
                  pbVar20 = pbVar18;
                }
                goto LAB_0015df56;
              }
              break;
            }
            pbVar21 = pbVar21 + 1;
            __n = __n - 1;
            bVar23 = pbVar21 < local_38;
          } while (bVar23);
        }
        bVar9 = 0;
        pbVar20 = pbVar21;
LAB_0015df56:
        if (bVar9 == 0) goto LAB_0015e8c8;
        bVar4 = *pbVar21;
        if (((((ulong)bVar4 == 0x48) && (pbVar21[1] == 0x54)) && (pbVar21[2] == 0x54)) &&
           (pbVar21[3] == 0x50)) {
          pbVar18 = pbVar20 + -(ulong)bVar9 + 1;
          (phVar19->state).reserved = bVar10 | 0x80;
          bVar23 = true;
          pbVar13 = pbVar21;
          if ((pbVar21 < pbVar18) && (*pbVar21 != 0x20)) {
            pbVar13 = (byte *)memchr(pbVar21,0x20,(long)pbVar18 - (long)pbVar21);
            bVar23 = pbVar13 == (byte *)0x0;
            if (bVar23) {
              pbVar13 = pbVar18;
            }
          }
          pbVar17 = local_50;
          if ((bVar23) ||
             (iVar12 = (*args->on_http_version)
                                 (phVar19,(char *)pbVar21,(long)pbVar13 - (long)pbVar21),
             pbVar17 = local_50, iVar12 != 0)) goto LAB_0015e8d7;
          pbVar21 = pbVar13 + 1;
          bVar23 = true;
          pbVar15 = pbVar21;
          if ((pbVar13 < pbVar20 + -(ulong)bVar9) && (*pbVar21 != 0x20)) {
            pbVar15 = (byte *)memchr(pbVar21,0x20,(long)pbVar18 - (long)pbVar21);
            bVar23 = pbVar15 == (byte *)0x0;
            if (bVar23) {
              pbVar15 = pbVar18;
            }
          }
          pbVar17 = local_50;
          if (bVar23) goto LAB_0015e8d7;
          phVar19 = args->parser;
          p_Var6 = args->on_status;
          sVar16 = atol((char *)pbVar21);
          iVar12 = (*p_Var6)(phVar19,sVar16,(char *)(pbVar15 + 1),(long)pbVar18 - (long)pbVar15);
joined_r0x0015e2ae:
          pbVar17 = local_50;
          if (iVar12 != 0) goto LAB_0015e8d7;
        }
        else {
          pp_Var14 = __ctype_tolower_loc();
          if ((*pp_Var14)[bVar4] - 0x61U < 0x1a) {
            pbVar18 = pbVar20 + -(ulong)bVar9 + 1;
            local_40 = (byte *)0x0;
            pbVar17 = pbVar21;
            local_48 = pbVar18;
            if (((pbVar18 <= pbVar21) || (*pbVar21 == 0x20)) ||
               ((local_50 = pbVar21,
                pbVar13 = (byte *)memchr(pbVar21,0x20,(long)pbVar18 - (long)pbVar21),
                pbVar17 = pbVar18, pbVar13 == (byte *)0x0 ||
                (local_50 = pbVar13,
                iVar12 = (*args->on_method)(phVar19,(char *)pbVar21,(long)pbVar13 - (long)pbVar21),
                pbVar17 = local_50, iVar12 != 0)))) goto LAB_0015e8d7;
            pbVar18 = pbVar13 + 1;
            if (((pbVar13[1] == 0x68) && (pbVar13[2] == 0x74)) &&
               ((pbVar13[3] == 0x74 && (pbVar13[4] == 0x70)))) {
              if (pbVar13[5] != 0x73) {
                if ((pbVar13[5] == 0x3a) && (pbVar13[6] == 0x2f)) {
                  lVar22 = 8;
                  bVar10 = pbVar13[7];
                  goto joined_r0x0015e0ca;
                }
                goto LAB_0015e13e;
              }
              if ((pbVar13[6] != 0x3a) || (pbVar13[7] != 0x2f)) goto LAB_0015e13e;
              lVar22 = 9;
              bVar10 = pbVar13[8];
joined_r0x0015e0ca:
              if (bVar10 != 0x2f) goto LAB_0015e13e;
              pbVar13 = pbVar13 + lVar22;
              local_50 = pbVar13;
              local_40 = pbVar13;
              uVar8 = seek2ch(&local_50,local_48,' ');
              pbVar17 = local_50;
              if (uVar8 == '\0') goto LAB_0015e8d7;
              *local_50 = 0x20;
              uVar8 = seek2ch(&local_40,local_50,'/');
              if (uVar8 != '\0') {
                *local_40 = 0x2f;
                pbVar18 = local_40;
                goto LAB_0015e141;
              }
              iVar12 = (*args->on_path)(args->parser,"/",1);
LAB_0015e24d:
              pbVar17 = local_50;
              if (iVar12 != 0) goto LAB_0015e8d7;
            }
            else {
LAB_0015e13e:
              pbVar13 = (byte *)0x0;
LAB_0015e141:
              pbVar17 = pbVar18;
              if (local_48 <= pbVar18) goto LAB_0015e8d7;
              if ((*pbVar18 == 0x3f) ||
                 (local_50 = pbVar18,
                 pbVar21 = (byte *)memchr(pbVar18,0x3f,(long)local_48 - (long)pbVar18),
                 pbVar21 == (byte *)0x0)) {
                pbVar21 = local_48;
                if ((*pbVar18 != 0x20) &&
                   (local_50 = pbVar18,
                   local_50 = (byte *)memchr(pbVar18,0x20,(long)local_48 - (long)pbVar18),
                   pbVar17 = pbVar21, local_50 != (byte *)0x0)) {
                  iVar12 = (*args->on_path)(args->parser,(char *)pbVar18,
                                            (long)local_50 - (long)pbVar18);
                  goto LAB_0015e24d;
                }
                goto LAB_0015e8d7;
              }
              local_50 = pbVar21;
              iVar12 = (*args->on_path)(args->parser,(char *)pbVar18,(long)pbVar21 - (long)pbVar18);
              pbVar18 = local_48;
              pbVar17 = local_50;
              if ((((iVar12 != 0) ||
                   (pbVar15 = pbVar21 + 1, pbVar17 = pbVar15, pbVar20 + -(ulong)bVar9 <= pbVar21))
                  || (*pbVar15 == 0x20)) ||
                 (local_50 = pbVar15,
                 local_50 = (byte *)memchr(pbVar15,0x20,(long)local_48 - (long)pbVar15),
                 pbVar17 = pbVar18, local_50 == (byte *)0x0)) goto LAB_0015e8d7;
              if (0 < (long)local_50 - (long)pbVar15) {
                iVar12 = (*args->on_query)(args->parser,(char *)pbVar15,
                                           (long)local_50 - (long)pbVar15);
                goto LAB_0015e24d;
              }
            }
            pbVar17 = local_50;
            if ((local_48 <= local_50 + 6) ||
               (iVar12 = (*args->on_http_version)
                                   (args->parser,(char *)(local_50 + 1),
                                    (long)local_48 - (long)(local_50 + 1)), pbVar17 = local_50,
               iVar12 != 0)) goto LAB_0015e8d7;
            if (pbVar13 != (byte *)0x0) {
              iVar12 = (*args->on_header)(args->parser,"host",4,(char *)pbVar13,
                                          (long)local_40 - (long)pbVar13);
              goto joined_r0x0015e2ae;
            }
          }
        }
        pbVar18 = pbVar20 + 1;
        puVar1 = &(args->parser->state).reserved;
        *puVar1 = *puVar1 | 1;
        pbVar21 = pbVar18;
      }
      do {
        pbVar20 = local_38;
        if (local_38 <= pbVar21) goto LAB_0015e8c8;
        bVar10 = *pbVar21;
        if ((bVar10 == 10) || (bVar10 == 0xd)) break;
        if ((pbVar18 < local_38) && (*pbVar18 != 10)) {
          pbVar18 = (byte *)memchr(pbVar18,10,(long)local_38 - (long)pbVar18);
          if (pbVar18 == (byte *)0x0) {
            bVar9 = 0;
          }
          else {
            bVar9 = (pbVar18[-1] == 0xd) + 1;
            pbVar20 = pbVar18;
          }
        }
        else {
          bVar9 = 0;
          pbVar20 = pbVar18;
        }
        if (bVar9 == 0) goto LAB_0015e8c8;
        pbVar13 = pbVar20 + (1 - (ulong)bVar9);
        bVar23 = true;
        pbVar18 = pbVar21;
        if ((bVar10 != 0x3a) && (pbVar21 < pbVar13)) {
          pbVar18 = (byte *)memchr(pbVar21,0x3a,(long)pbVar13 - (long)pbVar21);
          bVar23 = pbVar18 == (byte *)0x0;
          if (bVar23) {
            pbVar18 = pbVar13;
          }
        }
        pbVar17 = local_50;
        if (bVar23) goto LAB_0015e8d7;
        sVar16 = (long)pbVar18 - (long)pbVar21;
        if (pbVar21 <= pbVar18 && sVar16 != 0) {
          pp_Var14 = __ctype_tolower_loc();
          pbVar17 = pbVar21;
          do {
            *pbVar17 = *(byte *)(*pp_Var14 + *pbVar17);
            pbVar17 = pbVar17 + 1;
          } while (pbVar17 != pbVar18);
        }
        pbVar17 = pbVar18 + 1;
        if (pbVar18[1] == 0x20) {
          pbVar17 = pbVar18 + 2;
        }
        if (sVar16 == 7) {
          if (*(int *)(pbVar21 + 3) == 0x72656c69 && *(int *)pbVar21 == 0x69617274) {
            puVar1 = &(args->parser->state).reserved;
            *puVar1 = *puVar1 | 0x60;
          }
        }
        else if ((sVar16 == 0xe) &&
                (*(long *)(pbVar21 + 6) == 0x6874676e656c2d74 &&
                 *(long *)pbVar21 == 0x2d746e65746e6f63)) {
          lVar22 = atol((char *)pbVar17);
          (args->parser->state).content_length = lVar22;
        }
        else if ((sVar16 == 0x11) &&
                ((auVar24[0] = -(*pbVar21 == 't'), auVar24[1] = -(pbVar21[1] == 'r'),
                 auVar24[2] = -(pbVar21[2] == 'a'), auVar24[3] = -(pbVar21[3] == 'n'),
                 auVar24[4] = -(pbVar21[4] == 's'), auVar24[5] = -(pbVar21[5] == 'f'),
                 auVar24[6] = -(pbVar21[6] == 'e'), auVar24[7] = -(pbVar21[7] == 'r'),
                 auVar24[8] = -(pbVar21[8] == '-'), auVar24[9] = -(pbVar21[9] == 'e'),
                 auVar24[10] = -(pbVar21[10] == 'n'), auVar24[0xb] = -(pbVar21[0xb] == 'c'),
                 auVar24[0xc] = -(pbVar21[0xc] == 'o'), auVar24[0xd] = -(pbVar21[0xd] == 'd'),
                 auVar24[0xe] = -(pbVar21[0xe] == 'i'), auVar24[0xf] = -(pbVar21[0xf] == 'n'),
                 auVar25[0] = -(pbVar21[0x10] == 'g'), auVar25[1] = 0xff, auVar25[2] = 0xff,
                 auVar25[3] = 0xff, auVar25[4] = 0xff, auVar25[5] = 0xff, auVar25[6] = 0xff,
                 auVar25[7] = 0xff, auVar25[8] = 0xff, auVar25[9] = 0xff, auVar25[10] = 0xff,
                 auVar25[0xb] = 0xff, auVar25[0xc] = 0xff, auVar25[0xd] = 0xff, auVar25[0xe] = 0xff,
                 auVar25[0xf] = 0xff, auVar25 = auVar25 & auVar24,
                 (ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar25[0xf] >> 7) << 0xf) == 0xffff &&
                 (*(int *)(pbVar17 + 3) != 0x64656b6e || *(int *)pbVar17 != 0x6e756863)))) {
          puVar1 = &(args->parser->state).reserved;
          *puVar1 = *puVar1 | 0x40;
        }
        iVar12 = (*args->on_header)(args->parser,(char *)pbVar21,sVar16,(char *)pbVar17,
                                    (long)pbVar13 - (long)pbVar17);
        pbVar17 = local_50;
        if (iVar12 != 0) goto LAB_0015e8d7;
        pbVar18 = pbVar20 + 1;
        pbVar21 = pbVar18;
      } while (((args->parser->state).reserved & 2) == 0);
      pbVar18 = pbVar21 + 1;
      if (pbVar21[1] == 10) {
        pbVar18 = pbVar21 + 2;
      }
      puVar1 = &(args->parser->state).reserved;
      *puVar1 = *puVar1 | 2;
      pbVar21 = pbVar18;
    }
    phVar19 = args->parser;
    lVar22 = (phVar19->state).content_length;
    if ((lVar22 < 1) || (lVar5 = (phVar19->state).read, lVar22 <= lVar5)) {
      if ((0 < lVar22) || (((phVar19->state).reserved & 0x40) == 0)) goto LAB_0015e553;
      pbVar20 = (byte *)((long)args->buffer + args->length);
      while (pbVar21 < pbVar20) {
        pbVar17 = pbVar21;
        if ((args->parser->state).content_length == 0) {
          for (; (pbVar17 < pbVar20 && ((*pbVar17 == 0xd || (*pbVar17 == 10))));
              pbVar17 = pbVar17 + 1) {
          }
          iVar12 = 0;
          if ((pbVar21 < pbVar20) && (*pbVar21 != 10)) {
            pbVar21 = (byte *)memchr(pbVar21,10,(long)pbVar20 - (long)pbVar21);
            if (pbVar21 == (byte *)0x0) {
              bVar10 = 0;
              pbVar21 = pbVar20;
            }
            else {
              bVar10 = (pbVar21[-1] == 0xd) + 1;
            }
          }
          else {
            bVar10 = 0;
          }
          if (bVar10 == 0) {
LAB_0015e709:
            bVar7 = false;
            pbVar21 = pbVar17;
          }
          else {
            pbVar13 = pbVar21;
            if ((pbVar21 < pbVar17 + bVar10) && (pbVar17 = pbVar21, pbVar21 != (byte *)0x0)) {
              bVar23 = true;
              if ((pbVar21 < pbVar20) && (*pbVar21 != 10)) {
                pbVar13 = (byte *)memchr(pbVar21,10,(long)pbVar20 - (long)pbVar21);
                bVar23 = pbVar13 == (byte *)0x0;
                if (bVar23) {
                  pbVar13 = pbVar20;
                }
              }
              iVar12 = 0;
              bVar7 = false;
              if (!bVar23) goto LAB_0015e66e;
            }
            else {
LAB_0015e66e:
              lVar22 = strtol((char *)pbVar17,(char **)0x0,0x10);
              phVar19 = args->parser;
              (phVar19->state).content_length = -lVar22;
              pbVar17 = pbVar13 + 1;
              bVar7 = true;
              if (lVar22 == 0) {
                (phVar19->state).content_length = (phVar19->state).read;
                if ((pbVar17 < pbVar20) && (*pbVar17 != 10)) {
                  pbVar13 = (byte *)memchr(pbVar17,10,(long)pbVar20 - (long)pbVar17);
                  pbVar21 = pbVar13;
                  if (pbVar13 == (byte *)0x0) {
                    pbVar21 = pbVar20;
                  }
                  pbVar17 = pbVar21 + 1;
                  if (pbVar13 == (byte *)0x0) {
                    pbVar17 = pbVar20;
                  }
                }
                bVar10 = (phVar19->state).reserved;
                bVar23 = (bVar10 & 0x20) == 0;
                bVar9 = bVar10 & 0xdd;
                if (bVar23) {
                  bVar9 = bVar10 | 4;
                }
                iVar12 = (uint)bVar23 * 2 + -2;
                (phVar19->state).reserved = bVar9;
                goto LAB_0015e709;
              }
              iVar12 = (int)local_48;
              pbVar21 = pbVar17;
            }
          }
          local_48 = (byte *)CONCAT44(local_48._4_4_,iVar12);
          if (!bVar7) goto LAB_0015e55c;
        }
        pbVar17 = pbVar21 + -(args->parser->state).content_length;
        if (pbVar20 < pbVar21 + -(args->parser->state).content_length) {
          pbVar17 = pbVar20;
        }
        sVar16 = (long)pbVar17 - (long)pbVar21;
        if ((pbVar21 <= pbVar17 && sVar16 != 0) &&
           (iVar12 = (*args->on_body_chunk)(args->parser,(char *)pbVar21,sVar16), iVar12 != 0)) {
          iVar12 = -1;
          goto LAB_0015e55c;
        }
        phVar19 = args->parser;
        psVar2 = &(phVar19->state).read;
        *psVar2 = *psVar2 + sVar16;
        phVar3 = &phVar19->state;
        phVar3->content_length = phVar3->content_length + sVar16;
        pbVar21 = pbVar17;
      }
      iVar12 = 0;
    }
    else {
      pbVar20 = (byte *)((long)args->buffer + args->length);
      if (pbVar21 + (lVar22 - lVar5) <= pbVar20) {
        pbVar20 = pbVar21 + (lVar22 - lVar5);
      }
      sVar16 = (long)pbVar20 - (long)pbVar21;
      if (pbVar21 <= pbVar20 && sVar16 != 0) {
        iVar11 = (*args->on_body_chunk)(phVar19,(char *)pbVar21,sVar16);
        iVar12 = -1;
        if (iVar11 != 0) goto LAB_0015e55c;
      }
      phVar19 = args->parser;
      lVar22 = sVar16 + (phVar19->state).read;
      (phVar19->state).read = lVar22;
      iVar12 = 0;
      pbVar21 = pbVar20;
      if ((phVar19->state).content_length <= lVar22) {
LAB_0015e553:
        puVar1 = &(phVar19->state).reserved;
        *puVar1 = *puVar1 | 4;
        iVar12 = 0;
      }
    }
LAB_0015e55c:
    bVar10 = iVar12 == -2 ^ 3;
    if (iVar12 == -1) {
      bVar10 = 6;
    }
  } while (bVar10 == 2);
  pbVar17 = local_50;
  if (bVar10 == 6) {
LAB_0015e8d7:
    local_50 = pbVar17;
    (*args->on_error)(args->parser);
    phVar19 = args->parser;
    (phVar19->state).content_length = 0;
    (phVar19->state).read = 0;
    (phVar19->state).next = (uint8_t *)0x0;
    (phVar19->state).reserved = '\0';
    *(undefined7 *)&(phVar19->state).field_0x19 = 0;
    sVar16 = args->length;
  }
  else {
LAB_0015e893:
    phVar19 = args->parser;
    bVar10 = (phVar19->state).reserved;
    if ((bVar10 & 4) != 0) {
      (phVar19->state).next = pbVar21;
      iVar12 = (*(&args->on_request)[bVar10 >> 7])(phVar19);
      pbVar17 = local_50;
      if (iVar12 != 0) goto LAB_0015e8d7;
      phVar19 = args->parser;
      (phVar19->state).next = (uint8_t *)0x0;
      (phVar19->state).reserved = '\0';
      *(undefined7 *)&(phVar19->state).field_0x19 = 0;
      (phVar19->state).content_length = 0;
      (phVar19->state).read = 0;
    }
LAB_0015e8c8:
    sVar16 = (long)pbVar21 - (long)args->buffer;
  }
  return sVar16;
}

Assistant:

size_t http1_fio_parser_fn(struct http1_fio_parser_args_s *args) {
  assert(args->parser && args->buffer);
  args->parser->state.next = NULL;
  uint8_t *start = args->buffer;
  uint8_t *end = start;
  uint8_t *const stop = start + args->length;
  uint8_t eol_len = 0;
#define CONSUMED ((size_t)((uintptr_t)start - (uintptr_t)args->buffer))
// fprintf(stderr, "** resuming with at %p with %.*s...(%lu)\n", args->buffer,
// 4,
//         start, args->length);
re_eval:
  switch ((args->parser->state.reserved & 15)) {

  /* request / response line */
  case 0:
    /* clear out any leadinng white space */
    while ((start < stop) &&
           (*start == '\r' || *start == '\n' || *start == ' ' || *start == 0)) {
      ++start;
    }
    end = start;
    /* make sure the whole line is available*/
    if (!(eol_len = seek2eol(&end, stop)))
      return CONSUMED;

    if (start[0] == 'H' && start[1] == 'T' && start[2] == 'T' &&
        start[3] == 'P') {
      /* HTTP response */
      if (consume_response_line(args, start, end - eol_len + 1))
        goto error;
    } else if (tolower(start[0]) >= 'a' && tolower(start[0]) <= 'z') {
      /* HTTP request */
      if (consume_request_line(args, start, end - eol_len + 1))
        goto error;
    }
    end = start = end + 1;
    args->parser->state.reserved |= 1;

  /* fallthrough */
  /* headers */
  case 1:
    do {
      if (start >= stop)
        return CONSUMED; /* buffer ended on header line */
      if (*start == '\r' || *start == '\n') {
        goto finished_headers; /* empty line, end of headers */
      }
      if (!(eol_len = seek2eol(&end, stop)))
        return CONSUMED;
      if (consume_header(args, start, end - eol_len + 1))
        goto error;
      end = start = end + 1;
    } while ((args->parser->state.reserved & 2) == 0);
  finished_headers:
    ++start;
    if (*start == '\n')
      ++start;
    end = start;
    args->parser->state.reserved |= 2;
  /* fallthrough */
  /* request body */
  case 3: { /*  2 | 1 == 3 */
    int t3 = consume_body(args, &start);
    switch (t3) {
    case -1:
      goto error;
    case -2:
      goto re_eval;
    }
    break;
  }
  }
  /* are we done ? */
  if (args->parser->state.reserved & 4) {
    args->parser->state.next = start;
    if (((args->parser->state.reserved & 128) ? args->on_response
                                              : args->on_request)(args->parser))
      goto error;
    args->parser->state =
        (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  }
  return CONSUMED;
error:
  args->on_error(args->parser);
  args->parser->state =
      (struct http1_parser_protected_read_only_state_s){0, 0, 0};
  return args->length;
}